

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O0

void __thiscall
duckdb::SplitStringMapOperation::HandleValue
          (SplitStringMapOperation *this,char *buf,idx_t start_pos,idx_t pos)

{
  bool bVar1;
  undefined8 *puVar2;
  idx_t in_RDI;
  string_t sVar3;
  idx_t in_stack_00000068;
  idx_t in_stack_00000070;
  char *in_stack_00000078;
  Vector *in_stack_00000080;
  undefined1 in_stack_ffffffffffffffd0 [16];
  
  bVar1 = IsNull(in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_,in_RDI);
  if (bVar1) {
    FlatVector::SetNull((Vector *)this,(idx_t)buf,start_pos._7_1_);
    **(long **)(in_RDI + 0x10) = **(long **)(in_RDI + 0x10) + 1;
  }
  else {
    sVar3 = HandleString<true>(in_stack_00000080,in_stack_00000078,in_stack_00000070,
                               in_stack_00000068);
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 8) + **(long **)(in_RDI + 0x10) * 0x10);
    *puVar2 = sVar3.value._0_8_;
    puVar2[1] = sVar3.value._8_8_;
    **(long **)(in_RDI + 0x10) = **(long **)(in_RDI + 0x10) + 1;
  }
  return;
}

Assistant:

void HandleValue(const char *buf, idx_t start_pos, idx_t pos) {
		if (IsNull(buf, start_pos, pos)) {
			FlatVector::SetNull(varchar_val, child_start, true);
			child_start++;
			return;
		}
		child_val_data[child_start] = HandleString(varchar_val, buf, start_pos, pos);
		child_start++;
	}